

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

Token * __thiscall
EOPlus::Parser_Token_Server_Base::RejectToken
          (Token *__return_storage_ptr__,Parser_Token_Server_Base *this)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined3 uVar9;
  
  __return_storage_ptr__->type = (this->reject_token).type;
  uVar2 = *(undefined4 *)&(this->reject_token).data.field_0x4;
  uVar3 = *(undefined4 *)&(this->reject_token).data.val_float;
  uVar4 = *(undefined4 *)((long)&(this->reject_token).data.val_float + 4);
  (__return_storage_ptr__->data).val_int = (this->reject_token).data.val_int;
  *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = uVar2;
  *(undefined4 *)&(__return_storage_ptr__->data).val_float = uVar3;
  *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = uVar4;
  (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->data).val_string.field_2;
  pcVar1 = (this->reject_token).data.val_string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->data).val_string,pcVar1,
             pcVar1 + (this->reject_token).data.val_string._M_string_length);
  (__return_storage_ptr__->data).type = (this->reject_token).data.type;
  bVar5 = (this->reject_token).data.cache_val[0];
  bVar6 = (this->reject_token).data.cache_val[1];
  bVar7 = (this->reject_token).data.cache_val[2];
  bVar8 = (this->reject_token).data.cache_val[3];
  uVar9 = *(undefined3 *)&(this->reject_token).data.field_0x35;
  (__return_storage_ptr__->data).val_bool = (this->reject_token).data.val_bool;
  (__return_storage_ptr__->data).cache_val[0] = bVar5;
  (__return_storage_ptr__->data).cache_val[1] = bVar6;
  (__return_storage_ptr__->data).cache_val[2] = bVar7;
  (__return_storage_ptr__->data).cache_val[3] = bVar8;
  *(undefined3 *)&(__return_storage_ptr__->data).field_0x35 = uVar9;
  __return_storage_ptr__->newlines = (this->reject_token).newlines;
  return __return_storage_ptr__;
}

Assistant:

Token RejectToken() const { return this->reject_token; }